

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_SHA3.c
# Opt level: O0

Hacl_Streaming_Types_error_code
Hacl_Hash_SHA3_update(Hacl_Hash_SHA3_state_t *state,uint8_t *chunk,uint32_t chunk_len)

{
  ulong uVar1;
  uint64_t *puVar2;
  uint8_t *puVar3;
  undefined8 uVar4;
  Spec_Hash_Definitions_hash_alg SVar5;
  undefined7 uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  uint8_t *dst_1;
  uint64_t *s2_2;
  Spec_Hash_Definitions_hash_alg a1_2;
  uint8_t *data2_1;
  uint8_t *data1_1;
  uint32_t data2_len_1;
  uint32_t data1_len_1;
  uint32_t n_blocks_1;
  uint32_t ite_1;
  uint64_t *s2_3;
  Spec_Hash_Definitions_hash_alg a1_3;
  uint32_t sz1_2;
  uint64_t total_len1_2;
  uint8_t *buf_2;
  Hacl_Hash_SHA3_hash_buf block_state1_2;
  Hacl_Hash_SHA3_state_t s10;
  uint64_t total_len2_1;
  uint8_t *buf2_1;
  uint32_t sz10;
  uint64_t total_len10;
  uint8_t *buf0;
  Hacl_Hash_SHA3_hash_buf block_state10;
  Hacl_Hash_SHA3_state_t s1_2;
  uint8_t *chunk2;
  uint8_t *chunk1;
  uint32_t diff;
  uint8_t *dst;
  uint64_t *s2;
  Spec_Hash_Definitions_hash_alg a1;
  uint8_t *data2;
  uint8_t *data1;
  uint32_t data2_len;
  uint32_t data1_len;
  uint32_t n_blocks;
  uint32_t ite;
  uint64_t *s2_1;
  Spec_Hash_Definitions_hash_alg a1_1;
  uint32_t sz1_1;
  uint64_t total_len1_1;
  uint8_t *buf_1;
  Hacl_Hash_SHA3_hash_buf block_state1_1;
  Hacl_Hash_SHA3_state_t s1_1;
  uint64_t total_len2;
  uint8_t *buf2;
  uint32_t sz1;
  uint64_t total_len1;
  uint8_t *buf;
  Hacl_Hash_SHA3_hash_buf block_state1;
  Hacl_Hash_SHA3_state_t s1;
  uint32_t sz;
  Spec_Hash_Definitions_hash_alg i;
  uint64_t total_len;
  Hacl_Hash_SHA3_hash_buf block_state;
  Hacl_Hash_SHA3_state_t s;
  uint32_t chunk_len_local;
  uint8_t *chunk_local;
  Hacl_Hash_SHA3_state_t *state_local;
  
  uVar1 = state->total_len;
  total_len._0_1_ = (Spec_Hash_Definitions_hash_alg)*(undefined8 *)&state->block_state;
  if (-uVar1 - 1 < (ulong)chunk_len) {
    state_local._7_1_ = '\x03';
  }
  else {
    uVar7 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
    if ((uVar1 % (ulong)uVar7 == 0) && (uVar1 != 0)) {
      s1.total_len._0_4_ = block_len((Spec_Hash_Definitions_hash_alg)total_len);
    }
    else {
      uVar7 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
      s1.total_len._0_4_ = (uint32_t)(uVar1 % (ulong)uVar7);
    }
    uVar7 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
    if (uVar7 - (uint32_t)s1.total_len < chunk_len) {
      if ((uint32_t)s1.total_len == 0) {
        uVar4 = *(undefined8 *)&state->block_state;
        puVar2 = (state->block_state).snd;
        puVar3 = state->buf;
        uVar1 = state->total_len;
        uVar7 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
        if ((uVar1 % (ulong)uVar7 == 0) && (uVar1 != 0)) {
          s2_1._4_4_ = block_len((Spec_Hash_Definitions_hash_alg)total_len);
        }
        else {
          uVar7 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
          s2_1._4_4_ = (uint32_t)(uVar1 % (ulong)uVar7);
        }
        buf_1._0_1_ = (Spec_Hash_Definitions_hash_alg)uVar4;
        if (s2_1._4_4_ != 0) {
          uVar7 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
          uVar8 = block_len((Spec_Hash_Definitions_hash_alg)buf_1);
          Hacl_Hash_SHA3_update_multi_sha3
                    ((Spec_Hash_Definitions_hash_alg)buf_1,puVar2,puVar3,uVar7 / uVar8);
        }
        uVar7 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
        if (((ulong)chunk_len % (ulong)uVar7 == 0) && (chunk_len != 0)) {
          data1_len = block_len((Spec_Hash_Definitions_hash_alg)total_len);
        }
        else {
          uVar7 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
          data1_len = chunk_len % uVar7;
        }
        uVar7 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
        uVar8 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
        uVar9 = ((chunk_len - data1_len) / uVar7) * uVar8;
        uVar7 = block_len((Spec_Hash_Definitions_hash_alg)buf_1);
        Hacl_Hash_SHA3_update_multi_sha3
                  ((Spec_Hash_Definitions_hash_alg)buf_1,puVar2,chunk,uVar9 / uVar7);
        memcpy(puVar3,chunk + uVar9,(ulong)(chunk_len - uVar9));
        *(undefined8 *)&state->block_state = uVar4;
        (state->block_state).snd = puVar2;
        state->buf = puVar3;
        state->total_len = uVar1 + chunk_len;
      }
      else {
        uVar7 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
        uVar9 = uVar7 - (uint32_t)s1.total_len;
        SVar5 = (state->block_state).fst;
        uVar6 = *(undefined7 *)&(state->block_state).field_0x1;
        puVar2 = (state->block_state).snd;
        puVar3 = state->buf;
        uVar1 = state->total_len;
        uVar7 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
        if ((uVar1 % (ulong)uVar7 == 0) && (uVar1 != 0)) {
          buf2_1._4_4_ = block_len((Spec_Hash_Definitions_hash_alg)total_len);
        }
        else {
          uVar7 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
          buf2_1._4_4_ = (uint32_t)(uVar1 % (ulong)uVar7);
        }
        memcpy(puVar3 + buf2_1._4_4_,chunk,(ulong)uVar9);
        (state->block_state).fst = SVar5;
        *(undefined7 *)&(state->block_state).field_0x1 = uVar6;
        (state->block_state).snd = puVar2;
        state->buf = puVar3;
        state->total_len = uVar1 + uVar9;
        uVar4 = *(undefined8 *)&state->block_state;
        puVar2 = (state->block_state).snd;
        puVar3 = state->buf;
        uVar1 = state->total_len;
        uVar7 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
        if ((uVar1 % (ulong)uVar7 == 0) && (uVar1 != 0)) {
          s2_3._4_4_ = block_len((Spec_Hash_Definitions_hash_alg)total_len);
        }
        else {
          uVar7 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
          s2_3._4_4_ = (uint32_t)(uVar1 % (ulong)uVar7);
        }
        buf_2._0_1_ = (Spec_Hash_Definitions_hash_alg)uVar4;
        if (s2_3._4_4_ != 0) {
          uVar7 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
          uVar8 = block_len((Spec_Hash_Definitions_hash_alg)buf_2);
          Hacl_Hash_SHA3_update_multi_sha3
                    ((Spec_Hash_Definitions_hash_alg)buf_2,puVar2,puVar3,uVar7 / uVar8);
        }
        uVar7 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
        if (((ulong)(chunk_len - uVar9) % (ulong)uVar7 == 0) && (chunk_len != uVar9)) {
          data1_len_1 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
        }
        else {
          uVar7 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
          data1_len_1 = (chunk_len - uVar9) % uVar7;
        }
        uVar7 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
        uVar8 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
        uVar10 = (((chunk_len - uVar9) - data1_len_1) / uVar7) * uVar8;
        uVar7 = block_len((Spec_Hash_Definitions_hash_alg)buf_2);
        Hacl_Hash_SHA3_update_multi_sha3
                  ((Spec_Hash_Definitions_hash_alg)buf_2,puVar2,chunk + uVar9,uVar10 / uVar7);
        memcpy(puVar3,chunk + uVar9 + uVar10,(ulong)((chunk_len - uVar9) - uVar10));
        *(undefined8 *)&state->block_state = uVar4;
        (state->block_state).snd = puVar2;
        state->buf = puVar3;
        state->total_len = uVar1 + (chunk_len - uVar9);
      }
    }
    else {
      SVar5 = (state->block_state).fst;
      uVar6 = *(undefined7 *)&(state->block_state).field_0x1;
      puVar2 = (state->block_state).snd;
      puVar3 = state->buf;
      uVar1 = state->total_len;
      uVar7 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
      if ((uVar1 % (ulong)uVar7 == 0) && (uVar1 != 0)) {
        buf2._4_4_ = block_len((Spec_Hash_Definitions_hash_alg)total_len);
      }
      else {
        uVar7 = block_len((Spec_Hash_Definitions_hash_alg)total_len);
        buf2._4_4_ = (uint32_t)(uVar1 % (ulong)uVar7);
      }
      memcpy(puVar3 + buf2._4_4_,chunk,(ulong)chunk_len);
      (state->block_state).fst = SVar5;
      *(undefined7 *)&(state->block_state).field_0x1 = uVar6;
      (state->block_state).snd = puVar2;
      state->buf = puVar3;
      state->total_len = uVar1 + chunk_len;
    }
    state_local._7_1_ = '\0';
  }
  return state_local._7_1_;
}

Assistant:

Hacl_Streaming_Types_error_code
Hacl_Hash_SHA3_update(Hacl_Hash_SHA3_state_t *state, uint8_t *chunk, uint32_t chunk_len)
{
  Hacl_Hash_SHA3_state_t s = *state;
  Hacl_Hash_SHA3_hash_buf block_state = s.block_state;
  uint64_t total_len = s.total_len;
  Spec_Hash_Definitions_hash_alg i = block_state.fst;
  if ((uint64_t)chunk_len > 0xFFFFFFFFFFFFFFFFULL - total_len)
  {
    return Hacl_Streaming_Types_MaximumLengthExceeded;
  }
  uint32_t sz;
  if (total_len % (uint64_t)block_len(i) == 0ULL && total_len > 0ULL)
  {
    sz = block_len(i);
  }
  else
  {
    sz = (uint32_t)(total_len % (uint64_t)block_len(i));
  }
  if (chunk_len <= block_len(i) - sz)
  {
    Hacl_Hash_SHA3_state_t s1 = *state;
    Hacl_Hash_SHA3_hash_buf block_state1 = s1.block_state;
    uint8_t *buf = s1.buf;
    uint64_t total_len1 = s1.total_len;
    uint32_t sz1;
    if (total_len1 % (uint64_t)block_len(i) == 0ULL && total_len1 > 0ULL)
    {
      sz1 = block_len(i);
    }
    else
    {
      sz1 = (uint32_t)(total_len1 % (uint64_t)block_len(i));
    }
    uint8_t *buf2 = buf + sz1;
    memcpy(buf2, chunk, chunk_len * sizeof (uint8_t));
    uint64_t total_len2 = total_len1 + (uint64_t)chunk_len;
    *state
    =
      ((Hacl_Hash_SHA3_state_t){ .block_state = block_state1, .buf = buf, .total_len = total_len2 });
  }
  else if (sz == 0U)
  {
    Hacl_Hash_SHA3_state_t s1 = *state;
    Hacl_Hash_SHA3_hash_buf block_state1 = s1.block_state;
    uint8_t *buf = s1.buf;
    uint64_t total_len1 = s1.total_len;
    uint32_t sz1;
    if (total_len1 % (uint64_t)block_len(i) == 0ULL && total_len1 > 0ULL)
    {
      sz1 = block_len(i);
    }
    else
    {
      sz1 = (uint32_t)(total_len1 % (uint64_t)block_len(i));
    }
    if (!(sz1 == 0U))
    {
      Spec_Hash_Definitions_hash_alg a1 = block_state1.fst;
      uint64_t *s2 = block_state1.snd;
      Hacl_Hash_SHA3_update_multi_sha3(a1, s2, buf, block_len(i) / block_len(a1));
    }
    uint32_t ite;
    if ((uint64_t)chunk_len % (uint64_t)block_len(i) == 0ULL && (uint64_t)chunk_len > 0ULL)
    {
      ite = block_len(i);
    }
    else
    {
      ite = (uint32_t)((uint64_t)chunk_len % (uint64_t)block_len(i));
    }
    uint32_t n_blocks = (chunk_len - ite) / block_len(i);
    uint32_t data1_len = n_blocks * block_len(i);
    uint32_t data2_len = chunk_len - data1_len;
    uint8_t *data1 = chunk;
    uint8_t *data2 = chunk + data1_len;
    Spec_Hash_Definitions_hash_alg a1 = block_state1.fst;
    uint64_t *s2 = block_state1.snd;
    Hacl_Hash_SHA3_update_multi_sha3(a1, s2, data1, data1_len / block_len(a1));
    uint8_t *dst = buf;
    memcpy(dst, data2, data2_len * sizeof (uint8_t));
    *state
    =
      (
        (Hacl_Hash_SHA3_state_t){
          .block_state = block_state1,
          .buf = buf,
          .total_len = total_len1 + (uint64_t)chunk_len
        }
      );
  }
  else
  {
    uint32_t diff = block_len(i) - sz;
    uint8_t *chunk1 = chunk;
    uint8_t *chunk2 = chunk + diff;
    Hacl_Hash_SHA3_state_t s1 = *state;
    Hacl_Hash_SHA3_hash_buf block_state10 = s1.block_state;
    uint8_t *buf0 = s1.buf;
    uint64_t total_len10 = s1.total_len;
    uint32_t sz10;
    if (total_len10 % (uint64_t)block_len(i) == 0ULL && total_len10 > 0ULL)
    {
      sz10 = block_len(i);
    }
    else
    {
      sz10 = (uint32_t)(total_len10 % (uint64_t)block_len(i));
    }
    uint8_t *buf2 = buf0 + sz10;
    memcpy(buf2, chunk1, diff * sizeof (uint8_t));
    uint64_t total_len2 = total_len10 + (uint64_t)diff;
    *state
    =
      (
        (Hacl_Hash_SHA3_state_t){
          .block_state = block_state10,
          .buf = buf0,
          .total_len = total_len2
        }
      );
    Hacl_Hash_SHA3_state_t s10 = *state;
    Hacl_Hash_SHA3_hash_buf block_state1 = s10.block_state;
    uint8_t *buf = s10.buf;
    uint64_t total_len1 = s10.total_len;
    uint32_t sz1;
    if (total_len1 % (uint64_t)block_len(i) == 0ULL && total_len1 > 0ULL)
    {
      sz1 = block_len(i);
    }
    else
    {
      sz1 = (uint32_t)(total_len1 % (uint64_t)block_len(i));
    }
    if (!(sz1 == 0U))
    {
      Spec_Hash_Definitions_hash_alg a1 = block_state1.fst;
      uint64_t *s2 = block_state1.snd;
      Hacl_Hash_SHA3_update_multi_sha3(a1, s2, buf, block_len(i) / block_len(a1));
    }
    uint32_t ite;
    if
    (
      (uint64_t)(chunk_len - diff)
      % (uint64_t)block_len(i)
      == 0ULL
      && (uint64_t)(chunk_len - diff) > 0ULL
    )
    {
      ite = block_len(i);
    }
    else
    {
      ite = (uint32_t)((uint64_t)(chunk_len - diff) % (uint64_t)block_len(i));
    }
    uint32_t n_blocks = (chunk_len - diff - ite) / block_len(i);
    uint32_t data1_len = n_blocks * block_len(i);
    uint32_t data2_len = chunk_len - diff - data1_len;
    uint8_t *data1 = chunk2;
    uint8_t *data2 = chunk2 + data1_len;
    Spec_Hash_Definitions_hash_alg a1 = block_state1.fst;
    uint64_t *s2 = block_state1.snd;
    Hacl_Hash_SHA3_update_multi_sha3(a1, s2, data1, data1_len / block_len(a1));
    uint8_t *dst = buf;
    memcpy(dst, data2, data2_len * sizeof (uint8_t));
    *state
    =
      (
        (Hacl_Hash_SHA3_state_t){
          .block_state = block_state1,
          .buf = buf,
          .total_len = total_len1 + (uint64_t)(chunk_len - diff)
        }
      );
  }
  return Hacl_Streaming_Types_Success;
}